

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall
helics::apps::Player::addPublication
          (Player *this,string_view name,DataType type,string_view pubUnits)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *this_00;
  element_type *peVar1;
  _func_int *p_Var2;
  int iVar3;
  iterator iVar4;
  size_type sVar5;
  string *psVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  _Elt_pointer pPVar9;
  int iVar10;
  basic_string_view<char,_std::char_traits<char>_> __str;
  DataType type_local;
  string_view keyname;
  string_view pubUnits_local;
  string_view name_local;
  basic_string_view<char,_std::char_traits<char>_> localName;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  pubUnits_local._M_str = pubUnits._M_str;
  pubUnits_local._M_len = pubUnits._M_len;
  this_00 = &this->pubids;
  type_local = type;
  iVar4 = CLI::std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&name_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::operator<<((ostream *)&std::cerr,"publication already exists\n");
    return;
  }
  if ((this->super_App).useLocal != false) {
    sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&name_local,"./",0);
    if (sVar5 == 0xffffffffffffffff) {
      keyname._M_len =
           (size_t)(this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
      std::deque<helics::Publication,std::allocator<helics::Publication>>::
      emplace_back<helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,helics::DataType&,std::basic_string_view<char,std::char_traits<char>>&>
                ((deque<helics::Publication,std::allocator<helics::Publication>> *)
                 &this->publications,(CombinationFederate **)&keyname,&name_local,&type_local,
                 &pubUnits_local);
      goto LAB_00167f27;
    }
  }
  localName._M_len._0_4_ = 1;
  keyname._M_len =
       (size_t)(this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::deque<helics::Publication,std::allocator<helics::Publication>>::
  emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,helics::DataType&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::Publication,std::allocator<helics::Publication>> *)&this->publications,
             (InterfaceVisibility *)&localName,(CombinationFederate **)&keyname,&name_local,
             &type_local,&pubUnits_local);
LAB_00167f27:
  pPVar9 = (this->publications).
           super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pPVar9 == (this->publications).
                super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pPVar9 = (this->publications).
             super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  psVar6 = Interface::getName_abi_cxx11_(&pPVar9[-1].super_Interface);
  keyname._M_str = (psVar6->_M_dataplus)._M_p;
  keyname._M_len = psVar6->_M_string_length;
  sVar7 = CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::size
                    (&this->publications);
  iVar10 = (int)sVar7 + -1;
  pmVar8 = CLI::std::__detail::
           _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&keyname);
  *pmVar8 = iVar10;
  if ((this->super_App).useLocal == true) {
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (peVar1->super_ValueFederate)._vptr_ValueFederate[-3];
    sVar7 = *(size_type *)(&(peVar1->super_ValueFederate).field_0x80 + (long)p_Var2);
    __str._M_str = *(char **)(&(peVar1->super_ValueFederate).field_0x78 + (long)p_Var2);
    __str._M_len = sVar7;
    iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&keyname,0,sVar7,__str);
    if (iVar3 == 0) {
      localName = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&keyname,*(long *)(&(peVar1->super_ValueFederate).field_0x80 +
                                               (long)p_Var2) + 1,0xffffffffffffffff);
      pmVar8 = CLI::std::__detail::
               _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&localName);
      *pmVar8 = iVar10;
    }
  }
  return;
}

Assistant:

void Player::addPublication(std::string_view name, DataType type, std::string_view pubUnits)
{
    // skip already existing publications
    if (pubids.find(name) != pubids.end()) {
        std::cerr << "publication already exists\n";
        return;
    }
    if (!useLocal) {
        publications.emplace_back(
            helics::InterfaceVisibility::GLOBAL, fed.get(), name, type, pubUnits);
    } else {
        auto kp = name.find_first_of("./");
        if (kp == std::string::npos) {
            publications.emplace_back(fed.get(), name, type, pubUnits);
        } else {
            publications.emplace_back(
                helics::InterfaceVisibility::GLOBAL, fed.get(), name, type, pubUnits);
        }
    }
    std::string_view keyname = publications.back().getName();
    auto index = static_cast<int>(publications.size()) - 1;
    pubids[keyname] = index;
    if (useLocal) {
        auto& fedName = fed->getName();
        if (keyname.compare(0, fedName.size(), fedName) == 0) {
            auto localName = keyname.substr(fedName.size() + 1);
            pubids[localName] = index;
        }
    }
}